

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O3

void point_double(pt_prj_t_conflict4 *Q,pt_prj_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *out1_00;
  uint64_t *out1_01;
  fe_t_conflict1 t2;
  fe_t_conflict1 t1;
  fe_t_conflict1 t0;
  uint64_t local_178;
  long lStack_170;
  long local_168;
  long lStack_160;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  long local_138;
  long lStack_130;
  uint64_t local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  uint64_t local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  uint64_t local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  out1 = Q->Y;
  out1_00 = Q->T;
  out1_01 = Q->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(&local_88,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(&local_d8,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(&local_178,P->Z);
  local_128 = local_178 * 2;
  lStack_120 = lStack_170 * 2;
  local_118 = local_168 * 2;
  lStack_110 = lStack_160 * 2;
  local_108 = local_158 * 2;
  lStack_100 = lStack_150 * 2;
  local_f8 = local_148 * 2;
  lStack_f0 = lStack_140 * 2;
  local_e8 = local_138 * 2;
  lStack_e0 = lStack_130 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_128,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(Q->X,P->X,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(Q->X,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(out1,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,out1,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_01,out1_00,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_01,out1_01);
  Q->Y[0] = local_d8 + local_88;
  Q->Y[1] = local_d0 + local_80;
  Q->Y[2] = local_c8 + local_78;
  Q->Y[3] = local_c0 + local_70;
  Q->Y[4] = local_b8 + local_68;
  Q->Y[5] = local_b0 + local_60;
  Q->Y[6] = local_a8 + local_58;
  Q->Y[7] = local_a0 + local_50;
  Q->Y[8] = local_98 + local_48;
  Q->Y[9] = local_90 + local_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(&local_178,out1,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_178,&local_178);
  local_128 = (local_88 + 0x1ffffffffffb8e) - local_d8;
  lStack_120 = (local_80 + 0xffffffffffffe) - local_d0;
  local_118 = (local_78 + 0xffffffffffffe) - local_c8;
  lStack_110 = (local_70 + 0xffffffffffffe) - local_c0;
  local_108 = (local_68 + 0xffffffffffffe) - local_b8;
  local_f8 = (local_58 + 0xffffffffffffe) - local_a8;
  lStack_f0 = (local_50 + 0xffffffffffffe) - local_a0;
  local_e8 = (local_48 + 0xffffffffffffe) - local_98;
  lStack_e0 = (local_40 + 0xffffffffffffe) - local_90;
  lStack_100 = (local_60 - local_b0) + 0x1ffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_128,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Q->X,out1_01,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_00,out1_01,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_01,&local_178,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,out1,&local_128);
  return;
}

Assistant:

static void point_double(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X = P->X;
    const limb_t *Y = P->Y;
    const limb_t *Z = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(t0, X);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(t1, Y);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(t2, Z);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t3, X, Y);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, t3, t3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t4, Y, Z);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, X, Z);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, b, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Y3, Y3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(X3, Y3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, X3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, X3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(X3, X3, t3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, t2, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t2, t2, t3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, b, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Z3, Z3, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Z3, Z3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, t3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, t0, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t0, t3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(t0, t0, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t0, t0, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, Y3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t0, t4, t4);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, t0, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, t0, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, Z3);
}